

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 soft_f64_addsub(float64 a,float64 b,_Bool subtract,float_status *status)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [12];
  FloatClass FVar4;
  uint64_t a_00;
  float64 fVar5;
  FloatClass FVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  int count;
  ulong uVar11;
  FloatParts FVar12;
  FloatParts FVar13;
  FloatParts local_50;
  FloatParts local_40;
  
  FVar12 = float64_unpack_raw(a);
  FVar12 = sf_canonicalize(FVar12,&float64_params,status);
  auVar3 = FVar12._0_12_;
  iVar8 = FVar12.exp;
  uVar11 = FVar12.frac;
  FVar13 = float64_unpack_raw(b);
  local_40 = sf_canonicalize(FVar13,&float64_params,status);
  uVar9 = local_40._8_8_;
  a_00 = local_40.frac;
  bVar10 = FVar12.sign;
  FVar4 = local_40.cls;
  iVar7 = local_40.exp;
  FVar6 = FVar12.cls;
  local_50 = FVar12;
  if ((bool)bVar10 == (local_40.sign != subtract)) {
    if ((FVar6 != float_class_normal) || (FVar4 != float_class_normal)) {
      if (((FVar12._12_4_ | local_40._12_4_) & 0xfc) == 0) {
        if ((FVar6 == float_class_inf) || (FVar4 == float_class_zero)) goto LAB_00b200a5;
        if ((FVar6 != float_class_zero) && (FVar4 != float_class_inf)) {
LAB_00b1ffa5:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                     ,0x428,(char *)0x0);
        }
LAB_00b20107:
        local_40.sign = (_Bool)bVar10;
        FVar13 = local_40;
        FVar12.exp = local_40.exp;
        FVar12.cls = local_40.cls;
        FVar12.sign = local_40.sign;
        FVar12._14_2_ = local_40._14_2_;
        FVar12.frac = a_00;
        local_40 = FVar13;
        goto LAB_00b200a5;
      }
LAB_00b1ffc5:
      FVar12 = pick_nan(FVar12,local_40,status);
      goto LAB_00b200a5;
    }
    if (iVar8 - iVar7 == 0 || iVar8 < iVar7) {
      if (iVar8 < iVar7) {
        shift64RightJamming(uVar11,iVar7 - iVar8,&local_50.frac);
        local_50.exp = iVar7;
        auVar2._8_8_ = uVar9 & 0xffffffff;
        auVar2._0_8_ = local_50.frac;
        auVar3 = auVar2._0_12_;
      }
    }
    else {
      shift64RightJamming(a_00,iVar8 - iVar7,&local_40.frac);
      a_00 = local_40.frac;
    }
    uVar11 = auVar3._0_8_ + a_00;
    if ((long)uVar11 < 0) {
      uVar11 = (ulong)((uint)uVar11 & 1) | uVar11 >> 1;
      local_50.exp = auVar3._8_4_ + 1;
    }
  }
  else if ((FVar6 == float_class_normal) && (FVar4 == float_class_normal)) {
    count = iVar8 - iVar7;
    if ((count != 0 && iVar7 <= iVar8) || (a_00 <= uVar11 && count == 0)) {
      shift64RightJamming(a_00,count,&local_40.frac);
      uVar11 = uVar11 - local_40.frac;
    }
    else {
      shift64RightJamming(uVar11,iVar7 - iVar8,&local_50.frac);
      uVar11 = a_00 - local_50.frac;
      local_50.exp = iVar7;
      bVar10 = bVar10 ^ 1;
      iVar8 = iVar7;
    }
    if (uVar11 == 0) {
      local_50.cls = 1;
      bVar10 = status->float_rounding_mode == '\x01';
      uVar11 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      iVar7 = ((uint)lVar1 ^ 0x3f) - 1;
      uVar11 = uVar11 << ((byte)iVar7 & 0x3f);
      local_50.exp = iVar8 - iVar7;
    }
    local_50.sign = (_Bool)bVar10;
  }
  else {
    if (((FVar12._12_4_ | local_40._12_4_) & 0xfc) != 0) goto LAB_00b1ffc5;
    if (FVar6 == float_class_inf) {
      if (FVar4 == float_class_inf) {
        status->float_exception_flags = status->float_exception_flags | 1;
        FVar12.exp = 0x7fffffff;
        FVar12.cls = float_class_qnan;
        FVar12.sign = false;
        FVar12._14_2_ = 0;
        FVar12.frac = 0x2000000000000000;
      }
      goto LAB_00b200a5;
    }
    if ((FVar6 != float_class_zero) || (FVar4 != float_class_zero)) {
      if ((FVar6 != float_class_zero) && (FVar4 != float_class_inf)) {
        if (FVar4 != float_class_zero) goto LAB_00b1ffa5;
        goto LAB_00b200a5;
      }
      bVar10 = bVar10 ^ 1;
      goto LAB_00b20107;
    }
    local_50._14_2_ = FVar12._14_2_;
    local_50._0_13_ = FVar12._0_13_;
    local_50.sign = status->float_rounding_mode == '\x01';
  }
  FVar13 = local_50;
  FVar12.exp = local_50.exp;
  FVar12.cls = local_50.cls;
  FVar12.sign = local_50.sign;
  FVar12._14_2_ = local_50._14_2_;
  FVar12.frac = uVar11;
  local_50 = FVar13;
LAB_00b200a5:
  FVar12 = round_canonical(FVar12,status,&float64_params);
  fVar5 = float64_pack_raw(FVar12);
  return fVar5;
}

Assistant:

static float64 QEMU_SOFTFLOAT_ATTR
soft_f64_addsub(float64 a, float64 b, bool subtract, float_status *status)
{
    FloatParts pa = float64_unpack_canonical(a, status);
    FloatParts pb = float64_unpack_canonical(b, status);
    FloatParts pr = addsub_floats(pa, pb, subtract, status);

    return float64_round_pack_canonical(pr, status);
}